

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver.cpp
# Opt level: O0

QString * Driver::qtify(QString *name)

{
  bool bVar1;
  QChar QVar2;
  qsizetype qVar3;
  QChar *pQVar4;
  QString *in_RDI;
  long in_FS_OFFSET;
  qsizetype size;
  qsizetype i;
  QString *qname;
  QString *in_stack_ffffffffffffff98;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar5;
  QString *this;
  bool local_41;
  long local_38;
  QChar local_10;
  char16_t local_e;
  QChar local_c;
  char16_t local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  (in_RDI->d).d = (Data *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  (in_RDI->d).size = -0x5555555555555556;
  this = in_RDI;
  QString::QString((QString *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                   in_stack_ffffffffffffff98);
  local_a = (char16_t)
            QString::at(this,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
  QChar::QChar<char16_t,_true>(&local_c,L'Q');
  bVar1 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       (QChar *)in_stack_ffffffffffffff98);
  local_41 = true;
  if (!bVar1) {
    local_e = (char16_t)
              QString::at(this,CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0));
    QChar::QChar<char16_t,_true>(&local_10,L'K');
    local_41 = ::operator==((QChar *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            (QChar *)in_stack_ffffffffffffff98);
  }
  if (local_41 != false) {
    QString::remove((longlong)in_RDI,0);
  }
  local_38 = 0;
  qVar3 = QString::size(in_RDI);
  while( true ) {
    uVar5 = false;
    if (local_38 < qVar3) {
      QString::at(this,(ulong)in_stack_ffffffffffffffa0);
      uVar5 = QChar::isUpper((QChar *)0x177544);
    }
    if ((bool)uVar5 == false) break;
    QString::at(this,CONCAT17(uVar5,in_stack_ffffffffffffffa0));
    QVar2 = QChar::toLower((QChar *)CONCAT17(uVar5,in_stack_ffffffffffffffa0));
    pQVar4 = QString::operator[](in_stack_ffffffffffffff98,0x177584);
    pQVar4->ucs = QVar2.ucs;
    local_38 = local_38 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString Driver::qtify(const QString &name)
{
    QString qname = name;

    if (qname.at(0) == u'Q' || qname.at(0) == u'K')
        qname.remove(0, 1);

    for (qsizetype i = 0, size = qname.size(); i < size && qname.at(i).isUpper(); ++i)
        qname[i] = qname.at(i).toLower();

    return qname;
}